

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O0

xml_node<char> * __thiscall
rapidxml::xml_document<char>::parse_node<0>(xml_document<char> *this,char **text)

{
  char cVar1;
  uchar uVar2;
  xml_node<char> *pxVar3;
  parse_error *this_00;
  char **text_local;
  xml_document<char> *this_local;
  
  if (**text == '!') {
    cVar1 = (*text)[1];
    if (cVar1 == '-') {
      if ((*text)[2] == '-') {
        *text = *text + 3;
        pxVar3 = parse_comment<0>(this,text);
        return pxVar3;
      }
    }
    else if (cVar1 == 'D') {
      if ((((((*text)[2] == 'O') && ((*text)[3] == 'C')) && ((*text)[4] == 'T')) &&
          (((*text)[5] == 'Y' && ((*text)[6] == 'P')))) &&
         (((*text)[7] == 'E' && (uVar2 = whitespace_pred::test((*text)[8]), uVar2 != '\0')))) {
        *text = *text + 9;
        pxVar3 = parse_doctype<0>(this,text);
        return pxVar3;
      }
    }
    else if ((((cVar1 == '[') && ((*text)[2] == 'C')) &&
             (((*text)[3] == 'D' &&
              ((((*text)[4] == 'A' && ((*text)[5] == 'T')) && ((*text)[6] == 'A')))))) &&
            ((*text)[7] == '[')) {
      *text = *text + 8;
      pxVar3 = parse_cdata<0>(this,text);
      return pxVar3;
    }
    *text = *text + 1;
    while (**text != '>') {
      if (**text == '\0') {
        this_00 = (parse_error *)__cxa_allocate_exception(0x18);
        parse_error::parse_error(this_00,"unexpected end of data",*text);
        __cxa_throw(this_00,&parse_error::typeinfo,parse_error::~parse_error);
      }
      *text = *text + 1;
    }
    *text = *text + 1;
    this_local = (xml_document<char> *)0x0;
  }
  else if (**text == '?') {
    *text = *text + 1;
    if (((**text == 'x') || (**text == 'X')) &&
       ((((*text)[1] == 'm' || ((*text)[1] == 'M')) &&
        ((((*text)[2] == 'l' || ((*text)[2] == 'L')) &&
         (uVar2 = whitespace_pred::test((*text)[3]), uVar2 != '\0')))))) {
      *text = *text + 4;
      this_local = (xml_document<char> *)parse_xml_declaration<0>(this,text);
    }
    else {
      this_local = (xml_document<char> *)parse_pi<0>(this,text);
    }
  }
  else {
    this_local = (xml_document<char> *)parse_element<0>(this,text);
  }
  return &this_local->super_xml_node<char>;
}

Assistant:

xml_node<Ch> *parse_node(Ch *&text)
        {
            // Parse proper node type
            switch (text[0])
            {

            // <...
            default: 
                // Parse and append element node
                return parse_element<Flags>(text);

            // <?...
            case Ch('?'): 
                ++text;     // Skip ?
                if ((text[0] == Ch('x') || text[0] == Ch('X')) &&
                    (text[1] == Ch('m') || text[1] == Ch('M')) && 
                    (text[2] == Ch('l') || text[2] == Ch('L')) &&
                    whitespace_pred::test(text[3]))
                {
                    // '<?xml ' - xml declaration
                    text += 4;      // Skip 'xml '
                    return parse_xml_declaration<Flags>(text);
                }
                else
                {
                    // Parse PI
                    return parse_pi<Flags>(text);
                }
            
            // <!...
            case Ch('!'): 

                // Parse proper subset of <! node
                switch (text[1])    
                {
                
                // <!-
                case Ch('-'):
                    if (text[2] == Ch('-'))
                    {
                        // '<!--' - xml comment
                        text += 3;     // Skip '!--'
                        return parse_comment<Flags>(text);
                    }
                    break;

                // <![
                case Ch('['):
                    if (text[2] == Ch('C') && text[3] == Ch('D') && text[4] == Ch('A') && 
                        text[5] == Ch('T') && text[6] == Ch('A') && text[7] == Ch('['))
                    {
                        // '<![CDATA[' - cdata
                        text += 8;     // Skip '![CDATA['
                        return parse_cdata<Flags>(text);
                    }
                    break;

                // <!D
                case Ch('D'):
                    if (text[2] == Ch('O') && text[3] == Ch('C') && text[4] == Ch('T') && 
                        text[5] == Ch('Y') && text[6] == Ch('P') && text[7] == Ch('E') && 
                        whitespace_pred::test(text[8]))
                    {
                        // '<!DOCTYPE ' - doctype
                        text += 9;      // skip '!DOCTYPE '
                        return parse_doctype<Flags>(text);
                    }

                }   // switch

                // Attempt to skip other, unrecognized node types starting with <!
                ++text;     // Skip !
                while (*text != Ch('>'))
                {
                    if (*text == 0)
                        RAPIDXML_PARSE_ERROR("unexpected end of data", text);
                    ++text;
                }
                ++text;     // Skip '>'
                return 0;   // No node recognized

            }
        }